

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int go_to_page_before(stb_vorbis *f,uint limit_offset)

{
  uint32 uVar1;
  uint uVar2;
  uint in_ESI;
  uint end;
  uint previous_safe;
  uint32 *in_stack_00000020;
  stb_vorbis *in_stack_00000028;
  stb_vorbis *in_stack_ffffffffffffffd8;
  uint local_1c;
  
  set_file_offset(in_stack_ffffffffffffffd8,0);
  while( true ) {
    uVar1 = vorbis_find_page(in_stack_00000028,in_stack_00000020,&f->sample_rate);
    if (uVar1 == 0) {
      return 0;
    }
    if ((in_ESI <= local_1c) &&
       (uVar2 = stb_vorbis_get_file_offset(in_stack_ffffffffffffffd8), uVar2 < in_ESI)) break;
    set_file_offset(in_stack_ffffffffffffffd8,0);
  }
  return 1;
}

Assistant:

static int go_to_page_before(stb_vorbis *f, unsigned int limit_offset)
{
   unsigned int previous_safe, end;

   // now we want to seek back 64K from the limit
   if (limit_offset >= 65536 && limit_offset-65536 >= f->first_audio_page_offset)
      previous_safe = limit_offset - 65536;
   else
      previous_safe = f->first_audio_page_offset;

   set_file_offset(f, previous_safe);

   while (vorbis_find_page(f, &end, NULL)) {
      if (end >= limit_offset && stb_vorbis_get_file_offset(f) < limit_offset)
         return 1;
      set_file_offset(f, end);
   }

   return 0;
}